

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

uint32_t mpack_expect_native_u32(mpack_reader_t *reader)

{
  _Bool _Var1;
  mpack_error_t mVar2;
  uint32_t type;
  mpack_reader_t *reader_local;
  
  mVar2 = mpack_reader_error(reader);
  if (mVar2 == mpack_ok) {
    _Var1 = mpack_reader_ensure(reader,4);
    if (_Var1) {
      reader_local._4_4_ = mpack_load_u32(reader->data);
      reader->data = reader->data + 4;
    }
    else {
      reader_local._4_4_ = 0;
    }
  }
  else {
    reader_local._4_4_ = 0;
  }
  return reader_local._4_4_;
}

Assistant:

MPACK_STATIC_INLINE uint32_t mpack_expect_native_u32(mpack_reader_t* reader) {
    if (mpack_reader_error(reader) != mpack_ok)
        return 0;
    uint32_t type;
    if (!mpack_reader_ensure(reader, sizeof(type)))
        return 0;
    type = mpack_load_u32(reader->data);
    reader->data += sizeof(type);
    return type;
}